

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

bool __thiscall
cmCMakeHostSystemInformationCommand::InitialPass
          (cmCMakeHostSystemInformationCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  pointer pbVar5;
  long lVar6;
  bool bVar7;
  SystemInformation info;
  string result_list;
  string value;
  SystemInformation local_80;
  string local_78;
  string local_58;
  pointer local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) ||
     (iVar3 = std::__cxx11::string::compare((char *)pbVar1), iVar3 != 0)) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"missing RESULT specification.","");
    cmCommand::SetError(&this->super_cmCommand,&local_78);
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((0x7f < (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) &&
       (iVar3 = std::__cxx11::string::compare((char *)(pbVar1 + 2)), iVar3 == 0)) {
      cmsys::SystemInformation::SystemInformation(&local_80);
      cmsys::SystemInformation::RunCPUCheck(&local_80);
      cmsys::SystemInformation::RunOSCheck(&local_80);
      cmsys::SystemInformation::RunMemoryCheck(&local_80);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar7 = (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) < 0x80;
      local_38 = pbVar1;
      if (!bVar7) {
        uVar4 = 3;
        lVar6 = 0x60;
        do {
          if (uVar4 != 3) {
            std::__cxx11::string::append((char *)&local_78);
          }
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          bVar2 = GetValue(this,&local_80,(string *)((long)&(pbVar5->_M_dataplus)._M_p + lVar6),
                           &local_58);
          if (!bVar2) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_0029c1b9;
          }
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar2) goto LAB_0029c1b9;
          uVar4 = uVar4 + 1;
          pbVar5 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x20;
          bVar2 = uVar4 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5
                                 >> 5);
          bVar7 = !bVar2;
        } while (bVar2);
      }
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,local_38 + 1,local_78._M_dataplus._M_p);
LAB_0029c1b9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      cmsys::SystemInformation::~SystemInformation(&local_80);
      return bVar7;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"missing QUERY specification","");
    cmCommand::SetError(&this->super_cmCommand,&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return false;
}

Assistant:

bool cmCMakeHostSystemInformationCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT") {
    this->SetError("missing RESULT specification.");
    return false;
  }

  std::string const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY") {
    this->SetError("missing QUERY specification");
    return false;
  }

  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string result_list;
  for (size_t i = current_index + 1; i < args.size(); ++i) {
    std::string const& key = args[i];
    if (i != current_index + 1) {
      result_list += ";";
    }
    std::string value;
    if (!this->GetValue(info, key, value)) {
      return false;
    }
    result_list += value;
  }

  this->Makefile->AddDefinition(variable, result_list.c_str());

  return true;
}